

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O1

Ref<embree::SceneGraph::PerspectiveCameraNode> __thiscall
embree::TutorialScene::getDefaultCamera(TutorialScene *this)

{
  pointer pRVar1;
  long *in_RSI;
  
  if ((long *)in_RSI[1] == (long *)*in_RSI) {
    (this->cameras).
    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  }
  else {
    pRVar1 = *(pointer *)*in_RSI;
    (this->cameras).
    super__Vector_base<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>,_std::allocator<embree::Ref<embree::SceneGraph::PerspectiveCameraNode>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pRVar1;
    if (pRVar1 != (pointer)0x0) {
      (*(code *)(pRVar1->ptr->super_Node).fileName._M_dataplus._M_p)();
    }
  }
  return (Ref<embree::SceneGraph::PerspectiveCameraNode>)(PerspectiveCameraNode *)this;
}

Assistant:

Ref<SceneGraph::PerspectiveCameraNode> TutorialScene::getDefaultCamera()
  {
    if (cameras.size()) return cameras[0];
    return nullptr;
  }